

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hotring.cpp
# Opt level: O0

bool __thiscall HotRingInstance::HotRing::update(HotRing *this,string *key,string *val)

{
  ulong uVar1;
  htEntry *this_00;
  size_t sVar2;
  reference this_01;
  size_t index;
  size_t hashValue;
  htEntry *res;
  string *val_local;
  string *key_local;
  HotRing *this_local;
  
  this_00 = search(this,key);
  if (this_00 != (htEntry *)0x0) {
    sVar2 = std::
            hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&hash_fn_abi_cxx11_,key);
    uVar1 = this->hash_mask;
    htEntry::set_val(this_00,val);
    this_01 = std::vector<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>::
              operator[](&this->table,sVar2 & uVar1);
    hrHead::set_head(this_01,this_00);
  }
  return this_00 != (htEntry *)0x0;
}

Assistant:

bool HotRing::update(const string &key, const string &val){
        htEntry *res = search(key);
        if (res == nullptr) return false;

        size_t hashValue = hash_fn(key);
        size_t index = hashValue & hash_mask;
        res->set_val(val);
        table[index].set_head(res);

        return true;
    }